

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::equivalent(path *p1,path *p2)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  bool result;
  error_code ec;
  path *in_stack_00000088;
  path *in_stack_00000090;
  string *in_stack_00000098;
  filesystem_error *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  error_code *in_stack_000000c8;
  path *in_stack_000000d0;
  path *in_stack_000000d8;
  int in_stack_000001dc;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  error_code local_20 [2];
  
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar1 = equivalent(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  bVar2 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar2) {
    return bVar1;
  }
  uVar3 = __cxa_allocate_exception(0x90);
  std::error_code::value(local_20);
  detail::systemErrorText<int>(in_stack_000001dc);
  filesystem_error::filesystem_error
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             (error_code)in_stack_000000a8);
  __cxa_throw(uVar3,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool equivalent(const path& p1, const path& p2)
{
    std::error_code ec;
    bool result = equivalent(p1, p2, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p1, p2, ec);
    }
    return result;
}